

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O0

void __thiscall
OpenMD::InteractionManager::doPrePair(InteractionManager *this,InteractionData *idat)

{
  reference this_00;
  uint *puVar1;
  element_type *peVar2;
  element_type *peVar3;
  int *in_RSI;
  long in_RDI;
  int *iHash;
  InteractionManager *in_stack_00000d00;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_00000d00);
  }
  if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x110),(long)*in_RSI);
    puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)in_RSI[1]);
    if ((*puVar1 & 4) != 0) {
      peVar2 = std::__shared_ptr_access<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x394364);
      (*(peVar2->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction[7]
      )(peVar2,in_RSI);
    }
    if ((*puVar1 & 8) != 0) {
      peVar3 = std::__shared_ptr_access<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x39438f);
      (*(peVar3->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction[7]
      )(peVar3,in_RSI);
    }
  }
  return;
}

Assistant:

void InteractionManager::doPrePair(InteractionData& idat) {
    if (!initialized_) initialize();

    // excluded interaction, so just return
    if (idat.excluded) return;

    int& iHash = iHash_[idat.atid1][idat.atid2];

    if ((iHash & EAM_INTERACTION) != 0) eam_->calcDensity(idat);
    if ((iHash & SC_INTERACTION) != 0) sc_->calcDensity(idat);

    // set<NonBondedInteraction*>::iterator it;
    //
    // for (it = interactions_[ idat.atypes ].begin();
    //      it != interactions_[ idat.atypes ].end(); ++it){
    //   if ((*it)->getFamily() == METALLIC_EMBEDDING_FAMILY) {
    //     dynamic_cast<MetallicInteraction*>(*it)->calcDensity(idat);
    //   }
    // }

    return;
  }